

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O0

void __thiscall mp::NLSolution::~NLSolution(NLSolution *this)

{
  long in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  NLSuffixSet::~NLSuffixSet((NLSuffixSet *)0x12432c);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

operator bool() const { return solve_result_ > -2; }